

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

void Fl::release_widget_pointer(Fl_Widget **w)

{
  Fl_Widget **ppFVar1;
  Fl_Widget ***pppFVar2;
  int iVar3;
  long lVar4;
  
  pppFVar2 = widget_watch;
  if ((long)num_widget_watch < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      ppFVar1 = pppFVar2[lVar4];
      if (ppFVar1 != w) {
        if (iVar3 < lVar4) {
          pppFVar2[iVar3] = ppFVar1;
        }
        iVar3 = iVar3 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (num_widget_watch != lVar4);
  }
  num_widget_watch = iVar3;
  return;
}

Assistant:

void Fl::release_widget_pointer(Fl_Widget *&w)
{
  Fl_Widget **wp = &w;
  int i,j=0;
  for (i=0; i<num_widget_watch; ++i) {
    if (widget_watch[i]!=wp) {
      if (j<i) widget_watch[j] = widget_watch[i]; // fill gap
      j++;
    }
#ifdef DEBUG_WATCH
    else { // found widget pointer
      printf ("release_widget_pointer: (%d/%d) %8p => %8p\n",
	i+1,num_widget_watch,wp,*wp);
    }
#endif //DEBUG_WATCH
  }
  num_widget_watch = j;
#ifdef DEBUG_WATCH
  printf ("                        num_widget_watch = %d\n\n",num_widget_watch);
  fflush(stdout);
#endif // DEBUG_WATCH
  return;
}